

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repair_Complete_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Repair_Complete_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Repair_Complete_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Repair_Complete_PDU *local_18;
  Repair_Complete_PDU *this_local;
  
  local_18 = this;
  this_local = (Repair_Complete_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Repair Complete PDU-\n");
  Logistics_Header::GetAsString_abi_cxx11_(&local_210,&this->super_Logistics_Header);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tRepair Performed:      ");
  DATA_TYPE::ENUMS::GetEnumAsStringRepairTypePerformed_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)this->m_ui16Repair,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Repair_Complete_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Repair Complete PDU-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 )
       << "\tRepair Performed:      " << GetEnumAsStringRepairTypePerformed( m_ui16Repair )
       << "\n";

    return ss.str();
}